

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_cfg.cpp
# Opt level: O0

string * spvtools::val::ConstructErrorString
                   (string *__return_storage_ptr__,Construct *construct,string *header_string,
                   string *exit_string,string *dominate_text)

{
  ConstructType CVar1;
  ConstructType type;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_248;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_228;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_208;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_188;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_168;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_148;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_128;
  tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_108;
  tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_f0;
  undefined1 local_90 [8];
  string exit_name;
  string header_name;
  string construct_name;
  string *dominate_text_local;
  string *exit_string_local;
  string *header_string_local;
  Construct *construct_local;
  
  std::__cxx11::string::string((string *)(header_name.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)(exit_name.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)local_90);
  CVar1 = Construct::type(construct);
  ConstructNames_abi_cxx11_(&local_f0,(val *)(ulong)CVar1,type);
  std::tie<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>
            (&local_108,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             ((long)&header_name.field_2 + 8),
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             ((long)&exit_name.field_2 + 8),
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_90);
  std::tuple<std::__cxx11::string&,std::__cxx11::string&,std::__cxx11::string&>::operator=
            ((tuple<std::__cxx11::string&,std::__cxx11::string&,std::__cxx11::string&> *)&local_108,
             &local_f0);
  std::
  tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~tuple(&local_f0);
  std::operator+(&local_248,"The ",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&header_name.field_2 + 8));
  std::operator+(&local_228,&local_248," construct with the ");
  std::operator+(&local_208,&local_228,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&exit_name.field_2 + 8));
  std::operator+(&local_1e8,&local_208," ");
  std::operator+(&local_1c8,&local_1e8,header_string);
  std::operator+(&local_1a8,&local_1c8," ");
  std::operator+(&local_188,&local_1a8,dominate_text);
  std::operator+(&local_168,&local_188," the ");
  std::operator+(&local_148,&local_168,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_90);
  std::operator+(&local_128,&local_148," ");
  std::operator+(__return_storage_ptr__,&local_128,exit_string);
  std::__cxx11::string::~string((string *)&local_128);
  std::__cxx11::string::~string((string *)&local_148);
  std::__cxx11::string::~string((string *)&local_168);
  std::__cxx11::string::~string((string *)&local_188);
  std::__cxx11::string::~string((string *)&local_1a8);
  std::__cxx11::string::~string((string *)&local_1c8);
  std::__cxx11::string::~string((string *)&local_1e8);
  std::__cxx11::string::~string((string *)&local_208);
  std::__cxx11::string::~string((string *)&local_228);
  std::__cxx11::string::~string((string *)&local_248);
  std::__cxx11::string::~string((string *)local_90);
  std::__cxx11::string::~string((string *)(exit_name.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(header_name.field_2._M_local_buf + 8));
  return __return_storage_ptr__;
}

Assistant:

std::string ConstructErrorString(const Construct& construct,
                                 const std::string& header_string,
                                 const std::string& exit_string,
                                 const std::string& dominate_text) {
  std::string construct_name, header_name, exit_name;
  std::tie(construct_name, header_name, exit_name) =
      ConstructNames(construct.type());

  // TODO(umar): Add header block for continue constructs to error message
  return "The " + construct_name + " construct with the " + header_name + " " +
         header_string + " " + dominate_text + " the " + exit_name + " " +
         exit_string;
}